

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O2

Gen<int> * __thiscall
rc::gen::oneOf<int,int>(Gen<int> *__return_storage_ptr__,gen *this,Gen<int> *gen,Gen<int> *gens)

{
  OneOfGen<int> OStack_88;
  Gen<int> local_70;
  Gen<int> local_48;
  
  Gen<int>::Gen(&local_48,(Gen<int> *)this);
  Gen<int>::Gen(&local_70,gen);
  detail::OneOfGen<int>::OneOfGen<int,int>(&OStack_88,&local_48,&local_70);
  Gen<int>::Gen<rc::gen::detail::OneOfGen<int>,void>(__return_storage_ptr__,&OStack_88);
  std::vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>::~vector(&OStack_88.m_gens);
  Gen<int>::~Gen(&local_70);
  Gen<int>::~Gen(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}